

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic3_types.c
# Opt level: O2

void allocateCommitments2
               (commitments_t *commitments,picnic_instance_t *params,size_t numCommitments)

{
  byte bVar1;
  uint8_t **ppuVar2;
  size_t i;
  size_t sVar3;
  
  commitments->nCommitments = numCommitments;
  bVar1 = params->digest_size;
  ppuVar2 = (uint8_t **)malloc(((ulong)bVar1 + 8) * numCommitments);
  commitments->hashes = ppuVar2;
  ppuVar2 = ppuVar2 + numCommitments;
  for (sVar3 = 0; numCommitments != sVar3; sVar3 = sVar3 + 1) {
    commitments->hashes[sVar3] = (uint8_t *)ppuVar2;
    ppuVar2 = (uint8_t **)((long)ppuVar2 + (ulong)bVar1);
  }
  return;
}

Assistant:

void allocateCommitments2(commitments_t* commitments, const picnic_instance_t* params,
                          size_t numCommitments) {
  commitments->nCommitments = numCommitments;

  uint8_t* slab = malloc(numCommitments * params->digest_size + numCommitments * sizeof(uint8_t*));

  commitments->hashes = (uint8_t**)slab;
  slab += numCommitments * sizeof(uint8_t*);

  for (size_t i = 0; i < numCommitments; i++) {
    commitments->hashes[i] = slab;
    slab += params->digest_size;
  }
}